

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_long>
                   (appender out,write_int_arg<unsigned_long> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  uint uVar2;
  uint uVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  uint uVar6;
  uint64_t n;
  anon_class_16_3_9e397504_for_write_digits local_70;
  anon_class_40_3_03e05ccd_conflict local_60;
  write_int_data<char> data;
  
  n = arg.abs_value;
  pVar1 = specs->type;
  uVar3 = arg.prefix;
  local_70.abs_value._5_3_ = arg.abs_value._5_3_;
  local_70.abs_value._0_5_ = (undefined5)arg.abs_value;
  switch(pVar1) {
  case none:
  case dec:
    local_70.num_digits = do_count_digits(n);
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(local_70.num_digits);
      if (uVar3 != 0) {
        for (uVar3 = uVar3 & 0xffffff; uVar3 != 0; uVar3 = uVar3 >> 8) {
          local_60.prefix = CONCAT31(local_60.prefix._1_3_,(char)uVar3);
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                     (char *)&local_60);
        }
      }
      bVar4.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h:2200:41)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_70,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,local_70.num_digits,uVar3,specs);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_70.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_70.abs_value._5_3_;
      local_60.write_digits.num_digits = local_70.num_digits;
      local_60.prefix = uVar3;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_>
                     (out,specs,data.size,(anon_class_40_3_03e05ccd *)&local_60);
    }
    break;
  case oct:
    local_70.num_digits = count_digits<3,unsigned_long>(n);
    if (((specs->field_0x9 & 0x80) != 0) && (n != 0 && specs->precision <= local_70.num_digits)) {
      uVar2 = 0x3000;
      if (uVar3 == 0) {
        uVar2 = 0x30;
      }
      uVar3 = (uVar2 | uVar3) + 0x1000000;
    }
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(local_70.num_digits);
      if (uVar3 != 0) {
        for (uVar3 = uVar3 & 0xffffff; uVar3 != 0; uVar3 = uVar3 >> 8) {
          local_60.prefix = CONCAT31(local_60.prefix._1_3_,(char)uVar3);
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                     (char *)&local_60);
        }
      }
      bVar4.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h:2233:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_70,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,local_70.num_digits,uVar3,specs);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_70.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_70.abs_value._5_3_;
      local_60.write_digits.num_digits = local_70.num_digits;
      local_60.prefix = uVar3;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_>
                     (out,specs,data.size,(anon_class_40_3_03e05ccd *)&local_60);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar2 = uVar6 << 8;
      if (uVar3 == 0) {
        uVar2 = uVar6;
      }
      uVar3 = (uVar2 | uVar3) + 0x2000000;
    }
    local_70.num_digits = count_digits<4,unsigned_long>(n);
    local_70._13_3_ = 0;
    local_70.upper = pVar1 == hex_upper;
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(local_70.num_digits);
      if (uVar3 != 0) {
        for (uVar3 = uVar3 & 0xffffff; uVar3 != 0; uVar3 = uVar3 >> 8) {
          local_60.prefix = CONCAT31(local_60.prefix._1_3_,(char)uVar3);
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                     (char *)&local_60);
        }
      }
      bVar4.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h:2211:41)>
           ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                     (&local_70,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,local_70.num_digits,uVar3,specs);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_70.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_70.abs_value._5_3_;
      local_60.write_digits.num_digits = local_70.num_digits;
      local_60.write_digits.upper = local_70.upper;
      local_60.prefix = uVar3;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_>
                     (out,specs,data.size,&local_60);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar2 = uVar6 << 8;
      if (uVar3 == 0) {
        uVar2 = uVar6;
      }
      uVar3 = (uVar2 | uVar3) + 0x2000000;
    }
    local_70.num_digits = count_digits<1,unsigned_long>(n);
    if (specs->precision == -1 && specs->width == 0) {
      to_unsigned<int>(local_70.num_digits);
      if (uVar3 != 0) {
        for (uVar3 = uVar3 & 0xffffff; uVar3 != 0; uVar3 = uVar3 >> 8) {
          local_60.prefix = CONCAT31(local_60.prefix._1_3_,(char)uVar3);
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                     (char *)&local_60);
        }
      }
      bVar4.container =
           (buffer<char> *)
           write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h:2222:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_70,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      write_int_data<char>::write_int_data(&data,local_70.num_digits,uVar3,specs);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_70.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_70.abs_value._5_3_;
      local_60.write_digits.num_digits = local_70.num_digits;
      local_60.prefix = uVar3;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_>
                     (out,specs,data.size,(anon_class_40_3_03e05ccd *)&local_60);
    }
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    aVar5 = write_char<char,fmt::v10::appender>(out,(char)arg.abs_value,specs);
    return (appender)aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}